

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void on_amqp_frame_received
               (void *context,uint16_t channel,AMQP_VALUE performative,uchar *payload_bytes,
               uint32_t payload_size)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  ENDPOINT_INSTANCE *pEVar5;
  LOGGER_LOG p_Var6;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  ENDPOINT_INSTANCE *session_endpoint_1;
  LOGGER_LOG l_14;
  ENDPOINT_INSTANCE *session_endpoint;
  ENDPOINT_HANDLE pEStack_e8;
  _Bool remote_begin;
  ENDPOINT_HANDLE new_endpoint;
  LOGGER_LOG p_Stack_d8;
  uint16_t remote_channel;
  LOGGER_LOG l_13;
  BEGIN_HANDLE begin;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  uint64_t performative_ulong;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  ERROR_HANDLE error;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  CLOSE_HANDLE close_handle;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  OPEN_HANDLE open_handle;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_VALUE descriptor;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  CONNECTION_HANDLE connection;
  uchar *puStack_28;
  uint32_t payload_size_local;
  uchar *payload_bytes_local;
  AMQP_VALUE performative_local;
  void *pvStack_10;
  uint16_t channel_local;
  void *context_local;
  
  l = (LOGGER_LOG)context;
  connection._4_4_ = payload_size;
  puStack_28 = payload_bytes;
  payload_bytes_local = (uchar *)performative;
  performative_local._6_2_ = channel;
  pvStack_10 = context;
  iVar3 = tickcounter_get_current_ms
                    (*(TICK_COUNTER_HANDLE *)((long)context + 0x48),
                     (tickcounter_ms_t *)((long)context + 200));
  if (iVar3 == 0) {
    if (((byte)l[0xe0] & 1) != 0) {
      iVar3 = *(int *)(l + 0x10);
      if ((((iVar3 == 0) || (iVar3 == 2)) || (iVar3 - 4U < 2)) || ((iVar3 == 10 || (iVar3 == 0xd))))
      {
        iVar3 = xio_close(*(XIO_HANDLE *)l,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
        if ((iVar3 != 0) && (p_Var6 = xlogging_get_log_function(), p_Var6 != (LOGGER_LOG)0x0)) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"on_amqp_frame_received",0x44e,1,"xio_close failed");
        }
      }
      else if (payload_bytes_local == (uchar *)0x0) {
        close_connection_with_error
                  ((CONNECTION_HANDLE)l,"amqp:internal-error",
                   "connection_endpoint_frame_received::NULL performative",(AMQP_VALUE)0x0);
        descriptor = (AMQP_VALUE)xlogging_get_log_function();
        if (descriptor != (AMQP_VALUE)0x0) {
          (*(code *)descriptor)
                    (0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                     ,"on_amqp_frame_received",0x344,1,
                     "connection_endpoint_frame_received::NULL performative");
        }
      }
      else {
        l_2 = (LOGGER_LOG)amqpvalue_get_inplace_descriptor((AMQP_VALUE)payload_bytes_local);
        if (((byte)l[0xe0] >> 3 & 1) == 1) {
          log_incoming_frame((AMQP_VALUE)payload_bytes_local);
        }
        _Var2 = is_open_type_by_descriptor((AMQP_VALUE)l_2);
        if (_Var2) {
          if (performative_local._6_2_ != 0) {
            close_connection_with_error
                      ((CONNECTION_HANDLE)l,"amqp:not-allowed",
                       "OPEN frame received on a channel that is not 0",(AMQP_VALUE)0x0);
            l_3 = xlogging_get_log_function();
            if (l_3 != (LOGGER_LOG)0x0) {
              (*l_3)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                     ,"on_amqp_frame_received",0x356,1,
                     "OPEN frame received on a channel that is not 0");
            }
          }
          if (*(int *)(l + 0x10) == 9) {
            close_connection_with_error
                      ((CONNECTION_HANDLE)l,"amqp:illegal-state",
                       "OPEN frame received in the OPENED state",(AMQP_VALUE)0x0);
            open_handle = (OPEN_HANDLE)xlogging_get_log_function();
            if (open_handle != (OPEN_HANDLE)0x0) {
              (*(code *)open_handle)
                        (0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                         ,"on_amqp_frame_received",0x35d,1,"OPEN frame received in the OPENED state"
                        );
            }
          }
          else if ((*(int *)(l + 0x10) == 7) || (*(int *)(l + 0x10) == 3)) {
            iVar3 = amqpvalue_get_open((AMQP_VALUE)payload_bytes_local,(OPEN_HANDLE *)&l_4);
            if (iVar3 == 0) {
              iVar3 = open_get_idle_time_out((OPEN_HANDLE)l_4,(milliseconds *)(l + 0xb4));
              if (iVar3 == 0) {
                *(int *)(l + 0xb8) =
                     (int)(long)(*(double *)(l + 0xc0) * (double)*(uint *)(l + 0xb4));
              }
              iVar3 = open_get_max_frame_size((OPEN_HANDLE)l_4,(uint32_t *)(l + 0x50));
              if ((iVar3 == 0) && (0x1ff < *(uint *)(l + 0x50))) {
                if (*(int *)(l + 0x10) == 7) {
                  connection_set_state((CONNECTION_HANDLE)l,CONNECTION_STATE_OPENED);
                }
                else {
                  iVar3 = send_open_frame((CONNECTION_HANDLE)l);
                  if (iVar3 == 0) {
                    connection_set_state((CONNECTION_HANDLE)l,CONNECTION_STATE_OPENED);
                  }
                  else {
                    connection_set_state((CONNECTION_HANDLE)l,CONNECTION_STATE_END);
                  }
                }
              }
              else {
                close_connection_with_error
                          ((CONNECTION_HANDLE)l,"amqp:invalid-field",
                           "connection_endpoint_frame_received::failed parsing OPEN frame",
                           (AMQP_VALUE)0x0);
                l_6 = xlogging_get_log_function();
                if (l_6 != (LOGGER_LOG)0x0) {
                  (*l_6)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                         ,"on_amqp_frame_received",0x379,1,
                         "connection_endpoint_frame_received::failed parsing OPEN frame");
                }
              }
              open_destroy((OPEN_HANDLE)l_4);
            }
            else {
              close_connection_with_error
                        ((CONNECTION_HANDLE)l,"amqp:invalid-field",
                         "connection_endpoint_frame_received::failed parsing OPEN frame",
                         (AMQP_VALUE)0x0);
              l_5 = xlogging_get_log_function();
              if (l_5 != (LOGGER_LOG)0x0) {
                (*l_5)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"on_amqp_frame_received",0x368,1,
                       "connection_endpoint_frame_received::failed parsing OPEN frame");
              }
            }
          }
        }
        else {
          _Var2 = is_close_type_by_descriptor((AMQP_VALUE)l_2);
          if (_Var2) {
            if ((((*(int *)(l + 0x10) == 1) || (*(int *)(l + 0x10) == 3)) ||
                (*(int *)(l + 0x10) == 6)) ||
               ((*(int *)(l + 0x10) == 0xb || (*(int *)(l + 0x10) == 0xc)))) {
              iVar3 = xio_close(*(XIO_HANDLE *)l,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
              if ((iVar3 != 0) &&
                 (close_handle = (CLOSE_HANDLE)xlogging_get_log_function(),
                 close_handle != (CLOSE_HANDLE)0x0)) {
                (*(code *)close_handle)
                          (0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                           ,"on_amqp_frame_received",0x3a7,1,"xio_close failed");
              }
            }
            else if (*(ushort *)(l + 0xac) < performative_local._6_2_) {
              close_connection_with_error
                        ((CONNECTION_HANDLE)l,"amqp:invalid-field",
                         "connection_endpoint_frame_received::failed parsing CLOSE frame",
                         (AMQP_VALUE)0x0);
              l_8 = xlogging_get_log_function();
              if (l_8 != (LOGGER_LOG)0x0) {
                (*l_8)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"on_amqp_frame_received",0x3b2,1,
                       "connection_endpoint_frame_received::failed parsing CLOSE frame");
              }
            }
            else {
              iVar3 = amqpvalue_get_close((AMQP_VALUE)payload_bytes_local,(CLOSE_HANDLE *)&l_7);
              if (iVar3 == 0) {
                iVar3 = close_get_error((CLOSE_HANDLE)l_7,(ERROR_HANDLE *)&l_9);
                if (iVar3 != 0) {
                  l_9 = (LOGGER_LOG)0x0;
                }
                close_destroy((CLOSE_HANDLE)l_7);
                connection_set_state((CONNECTION_HANDLE)l,CONNECTION_STATE_CLOSE_RCVD);
                iVar3 = send_close_frame((CONNECTION_HANDLE)l,(ERROR_HANDLE)0x0);
                if ((iVar3 != 0) && (l_10 = xlogging_get_log_function(), l_10 != (LOGGER_LOG)0x0)) {
                  (*l_10)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                          ,"on_amqp_frame_received",0x3ca,1,"Cannot send CLOSE frame");
                }
                iVar3 = xio_close(*(XIO_HANDLE *)l,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
                if ((iVar3 != 0) &&
                   (performative_ulong = (uint64_t)xlogging_get_log_function(),
                   (LOGGER_LOG)performative_ulong != (LOGGER_LOG)0x0)) {
                  (*(code *)performative_ulong)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                             ,"on_amqp_frame_received",0x3d0,1,"xio_close failed");
                }
                connection_set_state((CONNECTION_HANDLE)l,CONNECTION_STATE_END);
                if (*(long *)(l + 0x98) != 0) {
                  (**(code **)(l + 0x98))(*(undefined8 *)(l + 0xa0),l_9);
                }
                error_destroy((ERROR_HANDLE)l_9);
              }
              else {
                close_connection_with_error
                          ((CONNECTION_HANDLE)l,"amqp:invalid-field",
                           "connection_endpoint_frame_received::failed parsing CLOSE frame",
                           (AMQP_VALUE)0x0);
                error = (ERROR_HANDLE)xlogging_get_log_function();
                if (error != (ERROR_HANDLE)0x0) {
                  (*(code *)error)(0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                                   ,"on_amqp_frame_received",0x3b9,1,
                                   "connection_endpoint_frame_received::failed parsing CLOSE frame")
                  ;
                }
              }
            }
          }
          else {
            iVar3 = amqpvalue_get_ulong((AMQP_VALUE)l_2,(uint64_t *)&l_11);
            if (iVar3 == 0) {
              if (l_11 == (LOGGER_LOG)0x11) {
                iVar3 = amqpvalue_get_begin((AMQP_VALUE)payload_bytes_local,(BEGIN_HANDLE *)&l_13);
                if (iVar3 == 0) {
                  pEStack_e8 = (ENDPOINT_HANDLE)0x0;
                  bVar1 = false;
                  iVar3 = begin_get_remote_channel
                                    ((BEGIN_HANDLE)l_13,(uint16_t *)((long)&new_endpoint + 6));
                  if ((iVar3 != 0) && (bVar1 = true, *(long *)(l + 0x68) != 0)) {
                    pEStack_e8 = connection_create_endpoint((CONNECTION_HANDLE)l);
                    uVar4 = (**(code **)(l + 0x68))(*(undefined8 *)(l + 0x70),pEStack_e8);
                    if ((uVar4 & 1) == 0) {
                      connection_destroy_endpoint(pEStack_e8);
                      pEStack_e8 = (ENDPOINT_HANDLE)0x0;
                    }
                  }
                  if (bVar1) {
                    if (pEStack_e8 != (ENDPOINT_HANDLE)0x0) {
                      pEStack_e8->incoming_channel = performative_local._6_2_;
                      (*pEStack_e8->on_endpoint_frame_received)
                                (pEStack_e8->callback_context,(AMQP_VALUE)payload_bytes_local,
                                 connection._4_4_,puStack_28);
                    }
                  }
                  else {
                    pEVar5 = find_session_endpoint_by_outgoing_channel
                                       ((CONNECTION_HANDLE)l,new_endpoint._6_2_);
                    if (pEVar5 == (ENDPOINT_INSTANCE *)0x0) {
                      p_Var6 = xlogging_get_log_function();
                      if (p_Var6 != (LOGGER_LOG)0x0) {
                        (*p_Var6)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                                  ,"on_amqp_frame_received",0x410,1,"Cannot create session endpoint"
                                 );
                      }
                    }
                    else {
                      pEVar5->incoming_channel = performative_local._6_2_;
                      (*pEVar5->on_endpoint_frame_received)
                                (pEVar5->callback_context,(AMQP_VALUE)payload_bytes_local,
                                 connection._4_4_,puStack_28);
                    }
                  }
                  begin_destroy((BEGIN_HANDLE)l_13);
                }
                else {
                  p_Stack_d8 = xlogging_get_log_function();
                  if (p_Stack_d8 != (LOGGER_LOG)0x0) {
                    (*p_Stack_d8)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                                  ,"on_amqp_frame_received",0x3f5,1,"Cannot get begin performative")
                    ;
                  }
                }
              }
              else if (l_11 + -0x12 < (code *)0x6) {
                pEVar5 = find_session_endpoint_by_incoming_channel
                                   ((CONNECTION_HANDLE)l,performative_local._6_2_);
                if (pEVar5 == (ENDPOINT_INSTANCE *)0x0) {
                  p_Var6 = xlogging_get_log_function();
                  if (p_Var6 != (LOGGER_LOG)0x0) {
                    (*p_Var6)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                              ,"on_amqp_frame_received",0x431,1,
                              "Cannot find session endpoint for channel %u",
                              (uint)performative_local._6_2_);
                  }
                }
                else {
                  (*pEVar5->on_endpoint_frame_received)
                            (pEVar5->callback_context,(AMQP_VALUE)payload_bytes_local,
                             connection._4_4_,puStack_28);
                }
              }
              else {
                begin = (BEGIN_HANDLE)xlogging_get_log_function();
                if (begin != (BEGIN_HANDLE)0x0) {
                  (*(code *)begin)(0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                                   ,"on_amqp_frame_received",0x3ec,1,"Bad performative: %02x",
                                   (int)l_11);
                }
              }
            }
            else {
              l_12 = xlogging_get_log_function();
              if (l_12 != (LOGGER_LOG)0x0) {
                (*l_12)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                        ,"on_amqp_frame_received",0x3e5,1,"Failed getting ulong amqp performative");
              }
            }
          }
        }
      }
    }
  }
  else {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
             ,"on_amqp_frame_received",0x336,1,"Cannot get tickcounter value");
    }
    close_connection_with_error
              ((CONNECTION_HANDLE)l,"amqp:internal-error","cannot get current tick count",
               (AMQP_VALUE)0x0);
  }
  return;
}

Assistant:

static void on_amqp_frame_received(void* context, uint16_t channel, AMQP_VALUE performative, const unsigned char* payload_bytes, uint32_t payload_size)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;

    (void)channel;

    if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_received_time) != 0)
    {
        LogError("Cannot get tickcounter value");
        close_connection_with_error(connection, "amqp:internal-error", "cannot get current tick count", NULL);
    }
    else
    {
        if (connection->is_underlying_io_open)
        {
            switch (connection->connection_state)
            {
            default:
                if (performative == NULL)
                {
                    /* Codes_S_R_S_CONNECTION_01_223: [If the on_endpoint_frame_received is called with a NULL performative then the connection shall be closed with the error condition amqp:internal-error and an implementation defined error description.] */
                    close_connection_with_error(connection, "amqp:internal-error", "connection_endpoint_frame_received::NULL performative", NULL);
                    LogError("connection_endpoint_frame_received::NULL performative");
                }
                else
                {
                    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

                    if (connection->is_trace_on == 1)
                    {
                        log_incoming_frame(performative);
                    }

                    if (is_open_type_by_descriptor(descriptor))
                    {
                        if (channel != 0)
                        {
                            /* Codes_S_R_S_CONNECTION_01_006: [The open frame can only be sent on channel 0.] */
                            /* Codes_S_R_S_CONNECTION_01_222: [If an Open frame is received in a manner violating the ISO specification, the connection shall be closed with condition amqp:not-allowed and description being an implementation defined string.] */
                            close_connection_with_error(connection, "amqp:not-allowed", "OPEN frame received on a channel that is not 0", NULL);
                            LogError("OPEN frame received on a channel that is not 0");
                        }

                        if (connection->connection_state == CONNECTION_STATE_OPENED)
                        {
                            /* Codes_S_R_S_CONNECTION_01_239: [If an Open frame is received in the Opened state the connection shall be closed with condition amqp:illegal-state and description being an implementation defined string.] */
                            close_connection_with_error(connection, "amqp:illegal-state", "OPEN frame received in the OPENED state", NULL);
                            LogError("OPEN frame received in the OPENED state");
                        }
                        else if ((connection->connection_state == CONNECTION_STATE_OPEN_SENT) ||
                            (connection->connection_state == CONNECTION_STATE_HDR_EXCH))
                        {
                            OPEN_HANDLE open_handle;
                            if (amqpvalue_get_open(performative, &open_handle) != 0)
                            {
                                /* Codes_S_R_S_CONNECTION_01_143: [If any of the values in the received open frame are invalid then the connection shall be closed.] */
                                /* Codes_S_R_S_CONNECTION_01_220: [The error amqp:invalid-field shall be set in the error.condition field of the CLOSE frame.] */
                                close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing OPEN frame", NULL);
                                LogError("connection_endpoint_frame_received::failed parsing OPEN frame");
                            }
                            else
                            {
                                if (open_get_idle_time_out(open_handle, &connection->remote_idle_timeout) == 0)
                                {
                                    /* since we obtained the remote_idle_timeout, compute at what millisecond we should send the empty frame */
                                    connection->remote_idle_timeout_send_frame_millisecond = (milliseconds)(connection->idle_timeout_empty_frame_send_ratio * connection->remote_idle_timeout);
                                }

                                if ((open_get_max_frame_size(open_handle, &connection->remote_max_frame_size) != 0) ||
                                    /* Codes_S_R_S_CONNECTION_01_167: [Both peers MUST accept frames of up to 512 (MIN-MAX-FRAME-SIZE) octets.] */
                                    (connection->remote_max_frame_size < 512))
                                {
                                    /* Codes_S_R_S_CONNECTION_01_143: [If any of the values in the received open frame are invalid then the connection shall be closed.] */
                                    /* Codes_S_R_S_CONNECTION_01_220: [The error amqp:invalid-field shall be set in the error.condition field of the CLOSE frame.] */
                                    close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing OPEN frame", NULL);
                                    LogError("connection_endpoint_frame_received::failed parsing OPEN frame");
                                }
                                else
                                {
                                    if (connection->connection_state == CONNECTION_STATE_OPEN_SENT)
                                    {
                                        connection_set_state(connection, CONNECTION_STATE_OPENED);
                                    }
                                    else
                                    {
                                        if (send_open_frame(connection) != 0)
                                        {
                                            connection_set_state(connection, CONNECTION_STATE_END);
                                        }
                                        else
                                        {
                                            connection_set_state(connection, CONNECTION_STATE_OPENED);
                                        }
                                    }
                                }

                                open_destroy(open_handle);
                            }
                        }
                        else
                        {
                            /* do nothing for now ... */
                        }
                    }
                    else if (is_close_type_by_descriptor(descriptor))
                    {
                        /* Codes_S_R_S_CONNECTION_01_242: [The connection module shall accept CLOSE frames even if they have extra payload bytes besides the Close performative.] */

                        /* Codes_S_R_S_CONNECTION_01_225: [HDR_RCVD HDR OPEN] */
                        if ((connection->connection_state == CONNECTION_STATE_HDR_RCVD) ||
                            /* Codes_S_R_S_CONNECTION_01_227: [HDR_EXCH OPEN OPEN] */
                            (connection->connection_state == CONNECTION_STATE_HDR_EXCH) ||
                            /* Codes_S_R_S_CONNECTION_01_228: [OPEN_RCVD OPEN *] */
                            (connection->connection_state == CONNECTION_STATE_OPEN_RCVD) ||
                            /* Codes_S_R_S_CONNECTION_01_235: [CLOSE_SENT - * TCP Close for Write] */
                            (connection->connection_state == CONNECTION_STATE_CLOSE_SENT) ||
                            /* Codes_S_R_S_CONNECTION_01_236: [DISCARDING - * TCP Close for Write] */
                            (connection->connection_state == CONNECTION_STATE_DISCARDING))
                        {
                            if (xio_close(connection->io, NULL, NULL) != 0)
                            {
                                LogError("xio_close failed");
                            }
                        }
                        else
                        {
                            CLOSE_HANDLE close_handle;

                            /* Codes_S_R_S_CONNECTION_01_012: [A close frame MAY be received on any channel up to the maximum channel number negotiated in open.] */
                            if (channel > connection->channel_max)
                            {
                                close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing CLOSE frame", NULL);
                                LogError("connection_endpoint_frame_received::failed parsing CLOSE frame");
                            }
                            else
                            {
                                if (amqpvalue_get_close(performative, &close_handle) != 0)
                                {
                                    close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing CLOSE frame", NULL);
                                    LogError("connection_endpoint_frame_received::failed parsing CLOSE frame");
                                }
                                else
                                {
                                    ERROR_HANDLE error;

                                    if (close_get_error(close_handle, &error) != 0)
                                    {
                                        error = NULL;
                                    }

                                    close_destroy(close_handle);

                                    connection_set_state(connection, CONNECTION_STATE_CLOSE_RCVD);

                                    if (send_close_frame(connection, NULL) != 0)
                                    {
                                        LogError("Cannot send CLOSE frame");
                                    }

                                    /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
                                    if (xio_close(connection->io, NULL, NULL) != 0)
                                    {
                                        LogError("xio_close failed");
                                    }

                                    connection_set_state(connection, CONNECTION_STATE_END);

                                    if (connection->on_connection_close_received_event_subscription.on_connection_close_received != NULL)
                                    {
                                        connection->on_connection_close_received_event_subscription.on_connection_close_received(connection->on_connection_close_received_event_subscription.context, error);
                                    }

                                    error_destroy(error);
                                }
                            }
                        }
                    }
                    else
                    {
                        uint64_t performative_ulong;

                        if (amqpvalue_get_ulong(descriptor, &performative_ulong) != 0)
                        {
                            LogError("Failed getting ulong amqp performative");
                        }
                        else
                        {
                            switch (performative_ulong)
                            {
                            default:
                                LogError("Bad performative: %02x", (unsigned int)performative_ulong);
                                break;

                            case AMQP_BEGIN:
                            {
                                BEGIN_HANDLE begin;

                                if (amqpvalue_get_begin(performative, &begin) != 0)
                                {
                                    LogError("Cannot get begin performative");
                                }
                                else
                                {
                                    uint16_t remote_channel;
                                    ENDPOINT_HANDLE new_endpoint = NULL;
                                    bool remote_begin = false;

                                    if (begin_get_remote_channel(begin, &remote_channel) != 0)
                                    {
                                        remote_begin = true;
                                        if (connection->on_new_endpoint != NULL)
                                        {
                                            new_endpoint = connection_create_endpoint(connection);
                                            if (!connection->on_new_endpoint(connection->on_new_endpoint_callback_context, new_endpoint))
                                            {
                                                connection_destroy_endpoint(new_endpoint);
                                                new_endpoint = NULL;
                                            }
                                        }
                                    }

                                    if (!remote_begin)
                                    {
                                        ENDPOINT_INSTANCE* session_endpoint = find_session_endpoint_by_outgoing_channel(connection, remote_channel);
                                        if (session_endpoint == NULL)
                                        {
                                            LogError("Cannot create session endpoint");
                                        }
                                        else
                                        {
                                            session_endpoint->incoming_channel = channel;
                                            session_endpoint->on_endpoint_frame_received(session_endpoint->callback_context, performative, payload_size, payload_bytes);
                                        }
                                    }
                                    else
                                    {
                                        if (new_endpoint != NULL)
                                        {
                                            new_endpoint->incoming_channel = channel;
                                            new_endpoint->on_endpoint_frame_received(new_endpoint->callback_context, performative, payload_size, payload_bytes);
                                        }
                                    }

                                    begin_destroy(begin);
                                }

                                break;
                            }

                            case AMQP_FLOW:
                            case AMQP_TRANSFER:
                            case AMQP_DISPOSITION:
                            case AMQP_END:
                            case AMQP_ATTACH:
                            case AMQP_DETACH:
                            {
                                ENDPOINT_INSTANCE* session_endpoint = find_session_endpoint_by_incoming_channel(connection, channel);
                                if (session_endpoint == NULL)
                                {
                                    LogError("Cannot find session endpoint for channel %u", (unsigned int)channel);
                                }
                                else
                                {
                                    session_endpoint->on_endpoint_frame_received(session_endpoint->callback_context, performative, payload_size, payload_bytes);
                                }

                                break;
                            }
                            }
                        }
                    }
                }
                break;

            case CONNECTION_STATE_START:
                /* Codes_S_R_S_CONNECTION_01_224: [START HDR HDR] */
            case CONNECTION_STATE_HDR_SENT:
                /* Codes_S_R_S_CONNECTION_01_226: [HDR_SENT OPEN HDR] */
            case CONNECTION_STATE_OPEN_PIPE:
                /* Codes_S_R_S_CONNECTION_01_230: [OPEN_PIPE ** HDR] */
            case CONNECTION_STATE_OC_PIPE:
                /* Codes_S_R_S_CONNECTION_01_232: [OC_PIPE - HDR TCP Close for Write] */
            case CONNECTION_STATE_CLOSE_RCVD:
                /* Codes_S_R_S_CONNECTION_01_234: [CLOSE_RCVD * - TCP Close for Read] */
            case CONNECTION_STATE_END:
                /* Codes_S_R_S_CONNECTION_01_237: [END - - TCP Close] */
                if (xio_close(connection->io, NULL, NULL) != 0)
                {
                    LogError("xio_close failed");
                }
                break;
            }
        }
    }
}